

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_179f8::la_diagnostic(archive *ar,la_ssize_t r)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  bVar5 = true;
  if (r < 0) {
    pcVar1 = archive_error_string(ar);
    bVar5 = 0xffffffffffffffeb < (ulong)r;
    pcVar4 = "unknown error";
    if (bVar5) {
      pcVar4 = "unknown warning";
    }
    pcVar3 = "cmake -E tar: error: ";
    if (bVar5) {
      pcVar3 = "cmake -E tar: warning: ";
    }
    if (pcVar1 != (char *)0x0) {
      pcVar4 = pcVar1;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2,'\n');
  }
  return bVar5;
}

Assistant:

bool la_diagnostic(struct archive* ar, __LA_SSIZE_T r)
{
  // See archive.h definition of ARCHIVE_OK for return values.

  if (r >= ARCHIVE_OK) {
    return true;
  }

  if (r >= ARCHIVE_WARN) {
    const char* warn = archive_error_string(ar);
    if (!warn) {
      warn = "unknown warning";
    }
    std::cerr << "cmake -E tar: warning: " << warn << '\n';
    return true;
  }

  // Error.
  const char* err = archive_error_string(ar);
  if (!err) {
    err = "unknown error";
  }
  std::cerr << "cmake -E tar: error: " << err << '\n';
  return false;
}